

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

BinarySequenceExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinarySequenceExprSyntax,slang::syntax::SyntaxKind&,slang::syntax::SequenceExprSyntax&,slang::parsing::Token&,slang::syntax::SequenceExprSyntax&>
          (BumpAllocator *this,SyntaxKind *args,SequenceExprSyntax *args_1,Token *args_2,
          SequenceExprSyntax *args_3)

{
  Token op;
  BinarySequenceExprSyntax *this_00;
  
  this_00 = (BinarySequenceExprSyntax *)allocate(this,0x30,8);
  op.kind = args_2->kind;
  op._2_1_ = args_2->field_0x2;
  op.numFlags.raw = (args_2->numFlags).raw;
  op.rawLen = args_2->rawLen;
  op.info = args_2->info;
  slang::syntax::BinarySequenceExprSyntax::BinarySequenceExprSyntax(this_00,*args,args_1,op,args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }